

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalStructuralDominance.cpp
# Opt level: O3

void wasm::LocalStructuralDominance::LocalStructuralDominance(wasm::Function*,wasm::Module&,wasm::
     LocalStructuralDominance::Mode)::Scanner::scan(Scanner*,wasm::Expression___
               (Scanner *self,Expression **currp)

{
  vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
  *this;
  Id IVar1;
  char *__function;
  Expression *currp_00;
  uint uVar2;
  long lVar3;
  LocalSet *set;
  Expression *pEVar4;
  StringNew *cast;
  ulong uVar5;
  uint local_3c;
  Expression *pEStack_38;
  Index index;
  Block *block;
  
  this = &self->cleanupStack;
LAB_00720254:
  pEVar4 = *currp;
  IVar1 = pEVar4->_id;
  pEStack_38 = pEVar4;
  switch(IVar1) {
  case InvalidId:
    goto switchD_00720278_caseD_0;
  case BlockId:
    if (pEVar4[1].type.id != 0) {
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                 doEndScope(Scanner*,wasm::Expression___,currp);
    }
    pEVar4 = pEStack_38;
    uVar2 = (uint)pEStack_38[2].type.id;
    if ((int)uVar2 < 1) goto LAB_00720523;
    uVar5 = (ulong)(uVar2 & 0x7fffffff);
    lVar3 = uVar5 * 8;
    uVar5 = uVar5 + 1;
    while (lVar3 = lVar3 + -8, uVar5 - 2 < pEVar4[2].type.id) {
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)(*(long *)(pEVar4 + 2) + lVar3));
      uVar5 = uVar5 - 1;
      if (uVar5 < 2) {
LAB_00720523:
        if (pEVar4[1].type.id != 0) {
          std::
          vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
          ::emplace_back<>(this);
          return;
        }
switchD_007204a0_caseD_1:
        return;
      }
    }
    goto LAB_00720c65;
  case IfId:
    if (*(long *)(pEVar4 + 2) == 0) {
LAB_007202cb:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                 doEndScope(Scanner*,wasm::Expression___,currp);
      if (pEVar4->_id == IfId) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)&pEVar4[1].type);
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                   doBeginScope(Scanner*,wasm::Expression___,currp);
        lVar3 = 0x10;
        if (pEVar4->_id == IfId) break;
      }
    }
    else {
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                 doEndScope(Scanner*,wasm::Expression___,currp);
      if (pEVar4->_id == IfId) {
        if (*(Expression **)(pEVar4 + 2) != (Expression *)0x0) {
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                     (Expression **)(pEVar4 + 2));
        }
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                   doBeginScope(Scanner*,wasm::Expression___,currp);
        goto LAB_007202cb;
      }
    }
    __function = "T *wasm::Expression::cast() [T = wasm::If]";
LAB_00720cf6:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                  ,0x31b,__function);
  case LoopId:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
               doEndScope(Scanner*,wasm::Expression___,currp);
    std::
    vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
    ::emplace_back<>(this);
    lVar3 = 0x20;
    if (pEVar4->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_00720cf6;
    }
    break;
  case BreakId:
  case SwitchId:
  case CallId:
  case CallIndirectId:
code_r0x0072048a:
    switch(IVar1) {
    case InvalidId:
    case NumExpressionIds:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                         ,0x103);
    default:
      goto switchD_007204a0_caseD_1;
    case BreakId:
      if (pEVar4[2].type.id != 0) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)&pEVar4[2].type);
      }
      if (*(long *)(pEVar4 + 2) == 0) {
        return;
      }
      goto switchD_007204a0_caseD_b;
    case SwitchId:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)&pEVar4[4].type);
      if (*(long *)(pEVar4 + 4) == 0) {
        return;
      }
      pEVar4 = pEVar4 + 4;
      goto LAB_00720c45;
    case CallId:
      uVar2 = (uint)pEVar4[1].type.id;
      if ((int)uVar2 < 1) {
        return;
      }
      uVar5 = (ulong)(uVar2 & 0x7fffffff);
      lVar3 = uVar5 * 8;
      uVar5 = uVar5 + 1;
      while (lVar3 = lVar3 + -8, uVar5 - 2 < pEVar4[1].type.id) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)(*(long *)(pEVar4 + 1) + lVar3));
        uVar5 = uVar5 - 1;
        if (uVar5 < 2) {
          return;
        }
      }
      break;
    case CallIndirectId:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)&pEVar4[3].type);
      if ((int)(uint)*(undefined8 *)(pEVar4 + 2) < 1) {
        return;
      }
      uVar5 = (ulong)((uint)*(undefined8 *)(pEVar4 + 2) & 0x7fffffff);
      lVar3 = uVar5 * 8;
      uVar5 = uVar5 + 1;
      while (lVar3 = lVar3 + -8, uVar5 - 2 < *(ulong *)(pEVar4 + 2)) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)(pEVar4[1].type.id + lVar3));
        uVar5 = uVar5 - 1;
        if (uVar5 < 2) {
          return;
        }
      }
      break;
    case GlobalSetId:
    case TableGetId:
      goto switchD_007204a0_caseD_b;
    case LoadId:
      goto switchD_007204a0_caseD_c;
    case StoreId:
    case SIMDLoadStoreLaneId:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)&pEVar4[3].type);
switchD_007204a0_caseD_c:
      pEVar4 = pEVar4 + 3;
      goto LAB_00720c45;
    case UnaryId:
    case SIMDExtractId:
    case StructGetId:
    case RefAsId:
    case StringMeasureId:
      goto switchD_007204a0_caseD_f;
    case BinaryId:
    case AtomicNotifyId:
    case SIMDShiftId:
    case StructSetId:
    case StructRMWId:
    case StringEqId:
      goto switchD_007204a0_caseD_10;
    case SelectId:
    case MemoryCopyId:
    case MemoryFillId:
    case TableCopyId:
    case ArraySetId:
    case StringSliceWTFId:
      goto LAB_00720c27;
    case DropId:
    case MemoryGrowId:
    case RefIsNullId:
    case TryTableId:
    case ThrowRefId:
    case TupleExtractId:
    case RefI31Id:
    case I31GetId:
    case RefTestId:
    case RefCastId:
    case ArrayLenId:
    case ContNewId:
      goto switchD_007204a0_caseD_12;
    case ReturnId:
      goto switchD_007204a0_caseD_13;
    case AtomicRMWId:
    case TableSetId:
    case TableGrowId:
    case ArrayNewDataId:
    case ArrayNewElemId:
      goto LAB_00720643;
    case AtomicCmpxchgId:
    case MemoryInitId:
    case TableFillId:
    case TableInitId:
      goto LAB_0072062e;
    case AtomicWaitId:
    case SIMDTernaryId:
    case StructCmpxchgId:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)&pEVar4[2].type);
      currp_00 = pEVar4 + 2;
      goto LAB_007205e1;
    case SIMDReplaceId:
      currp_00 = (Expression *)&pEVar4[2].type;
      goto LAB_007205e1;
    case SIMDShuffleId:
    case RefEqId:
    case ArrayGetId:
    case StringConcatId:
    case StringWTF16GetId:
      goto LAB_00720c3c;
    case SIMDLoadId:
    case BrOnId:
      pEVar4 = (Expression *)&pEVar4[2].type;
      goto LAB_00720c45;
    case TryId:
      if ((int)(uint)*(undefined8 *)(pEVar4 + 5) < 1) goto switchD_007204a0_caseD_b;
      uVar5 = (ulong)((uint)*(undefined8 *)(pEVar4 + 5) & 0x7fffffff);
      lVar3 = uVar5 * 8;
      uVar5 = uVar5 + 1;
      goto LAB_00720b4f;
    case ThrowId:
      uVar2 = (uint)pEVar4[2].type.id;
      if ((int)uVar2 < 1) {
        return;
      }
      uVar5 = (ulong)(uVar2 & 0x7fffffff);
      lVar3 = uVar5 * 8;
      uVar5 = uVar5 + 1;
      while (lVar3 = lVar3 + -8, uVar5 - 2 < pEVar4[2].type.id) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)(*(long *)(pEVar4 + 2) + lVar3));
        uVar5 = uVar5 - 1;
        if (uVar5 < 2) {
          return;
        }
      }
      break;
    case TupleMakeId:
      uVar2 = (uint)pEVar4[1].type.id;
      if ((int)uVar2 < 1) {
        return;
      }
      uVar5 = (ulong)(uVar2 & 0x7fffffff);
      lVar3 = uVar5 * 8;
      uVar5 = uVar5 + 1;
      while (lVar3 = lVar3 + -8, uVar5 - 2 < pEVar4[1].type.id) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)(*(long *)(pEVar4 + 1) + lVar3));
        uVar5 = uVar5 - 1;
        if (uVar5 < 2) {
          return;
        }
      }
      break;
    case CallRefId:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)(pEVar4 + 3));
      uVar2 = (uint)pEVar4[1].type.id;
      if ((int)uVar2 < 1) {
        return;
      }
      uVar5 = (ulong)(uVar2 & 0x7fffffff);
      lVar3 = uVar5 * 8;
      uVar5 = uVar5 + 1;
      while (lVar3 = lVar3 + -8, uVar5 - 2 < pEVar4[1].type.id) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)(*(long *)(pEVar4 + 1) + lVar3));
        uVar5 = uVar5 - 1;
        if (uVar5 < 2) {
          return;
        }
      }
      break;
    case StructNewId:
      uVar2 = (uint)pEVar4[1].type.id;
      if ((int)uVar2 < 1) {
        return;
      }
      uVar5 = (ulong)(uVar2 & 0x7fffffff);
      lVar3 = uVar5 * 8;
      uVar5 = uVar5 + 1;
      while (lVar3 = lVar3 + -8, uVar5 - 2 < pEVar4[1].type.id) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)(*(long *)(pEVar4 + 1) + lVar3));
        uVar5 = uVar5 - 1;
        if (uVar5 < 2) {
          return;
        }
      }
      break;
    case ArrayNewId:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)&pEVar4[1].type);
switchD_007204a0_caseD_13:
      if (*(long *)(pEVar4 + 1) == 0) {
        return;
      }
switchD_007204a0_caseD_12:
      pEVar4 = pEVar4 + 1;
      goto LAB_00720c45;
    case ArrayNewFixedId:
      uVar2 = (uint)pEVar4[1].type.id;
      if ((int)uVar2 < 1) {
        return;
      }
      uVar5 = (ulong)(uVar2 & 0x7fffffff);
      lVar3 = uVar5 * 8;
      uVar5 = uVar5 + 1;
      while (lVar3 = lVar3 + -8, uVar5 - 2 < pEVar4[1].type.id) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)(*(long *)(pEVar4 + 1) + lVar3));
        uVar5 = uVar5 - 1;
        if (uVar5 < 2) {
          return;
        }
      }
      break;
    case ArrayCopyId:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)(pEVar4 + 3));
      goto LAB_00720c18;
    case ArrayFillId:
LAB_00720c18:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)&pEVar4[2].type);
LAB_00720c27:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)(pEVar4 + 2));
LAB_00720c3c:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)&pEVar4[1].type);
      goto switchD_007204a0_caseD_12;
    case ArrayInitDataId:
    case ArrayInitElemId:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)&pEVar4[3].type);
LAB_0072062e:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)(pEVar4 + 3));
LAB_00720643:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)&pEVar4[2].type);
      goto switchD_007204a0_caseD_b;
    case StringNewId:
      if (pEVar4[2].type.id != 0) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)&pEVar4[2].type);
      }
      if (*(long *)(pEVar4 + 2) != 0) goto switchD_007204a0_caseD_10;
      goto switchD_007204a0_caseD_f;
    case StringEncodeId:
      if (pEVar4[2].type.id != 0) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)&pEVar4[2].type);
      }
switchD_007204a0_caseD_10:
      currp_00 = pEVar4 + 2;
LAB_007205e1:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)currp_00);
switchD_007204a0_caseD_f:
      pEVar4 = (Expression *)&pEVar4[1].type;
      goto LAB_00720c45;
    case ContBindId:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)(pEVar4 + 3));
      uVar2 = (uint)pEVar4[1].type.id;
      if ((int)uVar2 < 1) {
        return;
      }
      uVar5 = (ulong)(uVar2 & 0x7fffffff);
      lVar3 = uVar5 * 8;
      uVar5 = uVar5 + 1;
      while (lVar3 = lVar3 + -8, uVar5 - 2 < pEVar4[1].type.id) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)(*(long *)(pEVar4 + 1) + lVar3));
        uVar5 = uVar5 - 1;
        if (uVar5 < 2) {
          return;
        }
      }
      break;
    case SuspendId:
      uVar2 = (uint)pEVar4[2].type.id;
      if ((int)uVar2 < 1) {
        return;
      }
      uVar5 = (ulong)(uVar2 & 0x7fffffff);
      lVar3 = uVar5 * 8;
      uVar5 = uVar5 + 1;
      while (lVar3 = lVar3 + -8, uVar5 - 2 < pEVar4[2].type.id) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)(*(long *)(pEVar4 + 2) + lVar3));
        uVar5 = uVar5 - 1;
        if (uVar5 < 2) {
          return;
        }
      }
      break;
    case ResumeId:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)(pEVar4 + 7));
      uVar2 = (uint)pEVar4[5].type.id;
      if ((int)uVar2 < 1) {
        return;
      }
      uVar5 = (ulong)(uVar2 & 0x7fffffff);
      lVar3 = uVar5 * 8;
      uVar5 = uVar5 + 1;
      while (lVar3 = lVar3 + -8, uVar5 - 2 < pEVar4[5].type.id) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)(*(long *)(pEVar4 + 5) + lVar3));
        uVar5 = uVar5 - 1;
        if (uVar5 < 2) {
          return;
        }
      }
      break;
    case ResumeThrowId:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)(pEVar4 + 8));
      uVar2 = (uint)pEVar4[6].type.id;
      if ((int)uVar2 < 1) {
        return;
      }
      uVar5 = (ulong)(uVar2 & 0x7fffffff);
      lVar3 = uVar5 * 8;
      uVar5 = uVar5 + 1;
      while (lVar3 = lVar3 + -8, uVar5 - 2 < pEVar4[6].type.id) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)(*(long *)(pEVar4 + 6) + lVar3));
        uVar5 = uVar5 - 1;
        if (uVar5 < 2) {
          return;
        }
      }
      break;
    case StackSwitchId:
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                 (Expression **)(pEVar4 + 4));
      uVar2 = (uint)pEVar4[2].type.id;
      if ((int)uVar2 < 1) {
        return;
      }
      uVar5 = (ulong)(uVar2 & 0x7fffffff);
      lVar3 = uVar5 * 8;
      uVar5 = uVar5 + 1;
      while (lVar3 = lVar3 + -8, uVar5 - 2 < pEVar4[2].type.id) {
        Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                   (Expression **)(*(long *)(pEVar4 + 2) + lVar3));
        uVar5 = uVar5 - 1;
        if (uVar5 < 2) {
          return;
        }
      }
    }
LAB_00720c65:
    __assert_fail("index < usedElements",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                  ,0xbc,
                  "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                 );
  case LocalGetId:
    local_3c = *(uint *)(pEVar4 + 1);
    if (((self->localsSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_3c >> 6] >>
         ((ulong)local_3c & 0x3f) & 1) != 0) {
      return;
    }
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)self->nonDominatingIndices,&local_3c);
    return;
  case LocalSetId:
    lVar3 = 0x18;
    if (((self->localsSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[*(uint *)(pEVar4 + 1) >> 6]
         >> ((ulong)*(uint *)(pEVar4 + 1) & 0x3f) & 1) == 0) {
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                 doLocalSet(Scanner*,wasm::Expression___,currp);
    }
    break;
  default:
    if (IVar1 == TryId) {
      if (0 < (int)(uint)*(undefined8 *)(pEVar4 + 5)) {
        uVar5 = (ulong)((uint)*(undefined8 *)(pEVar4 + 5) & 0x7fffffff);
        lVar3 = uVar5 * 8;
        uVar5 = uVar5 + 1;
        do {
          lVar3 = lVar3 + -8;
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                     doEndScope(Scanner*,wasm::Expression___,currp);
          pEVar4 = pEStack_38;
          if (*(ulong *)(pEStack_38 + 5) <= uVar5 - 2) goto LAB_00720c65;
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
                     (Expression **)(pEStack_38[4].type.id + lVar3));
          Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                    ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                     doBeginScope(Scanner*,wasm::Expression___,currp);
          uVar5 = uVar5 - 1;
        } while (1 < uVar5);
      }
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                 doEndScope(Scanner*,wasm::Expression___,currp);
      std::
      vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
      ::emplace_back<>(this);
      lVar3 = 0x20;
      if (pEVar4->_id != TryId) {
        __function = "T *wasm::Expression::cast() [T = wasm::Try]";
        goto LAB_00720cf6;
      }
    }
    else {
      if (IVar1 != TryTableId) goto code_r0x0072048a;
      Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
                ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,
                 doEndScope(Scanner*,wasm::Expression___,currp);
      std::
      vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
      ::emplace_back<>(this);
      lVar3 = 0x10;
      if (pEVar4->_id != TryTableId) {
        __function = "T *wasm::Expression::cast() [T = wasm::TryTable]";
        goto LAB_00720cf6;
      }
    }
  }
  currp = (Expression **)(&pEVar4->_id + lVar3);
  goto LAB_00720254;
LAB_00720b4f:
  lVar3 = lVar3 + -8;
  if (*(ulong *)(pEVar4 + 5) <= uVar5 - 2) goto LAB_00720c65;
  Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
            ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
             (Expression **)(pEVar4[4].type.id + lVar3));
  uVar5 = uVar5 - 1;
  if (uVar5 < 2) {
switchD_007204a0_caseD_b:
    pEVar4 = pEVar4 + 2;
LAB_00720c45:
    Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *)self,Expression___,
               (Expression **)pEVar4);
    return;
  }
  goto LAB_00720b4f;
switchD_00720278_caseD_0:
  handle_unreachable("bad id",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalStructuralDominance.cpp"
                     ,0x89);
}

Assistant:

static void scan(Scanner* self, Expression** currp) {
      // Use a loop to avoid recursing on the last child - we can just go
      // straight into a loop iteration for it.
      while (1) {
        Expression* curr = *currp;

        switch (curr->_id) {
          case Expression::Id::InvalidId:
            WASM_UNREACHABLE("bad id");

          // local.get can just be visited immediately, as it has no children.
          case Expression::Id::LocalGetId: {
            auto index = curr->cast<LocalGet>()->index;
            if (!self->localsSet[index]) {
              self->nonDominatingIndices.insert(index);
            }
            return;
          }
          case Expression::Id::LocalSetId: {
            auto* set = curr->cast<LocalSet>();
            if (!self->localsSet[set->index]) {
              self->pushTask(doLocalSet, currp);
            }
            // Immediately continue in the loop.
            currp = &set->value;
            continue;
          }

          // Control flow structures.
          case Expression::Id::BlockId: {
            auto* block = curr->cast<Block>();
            // Blocks with no name are never emitted in the binary format, so do
            // not create a scope for them.
            if (block->name.is()) {
              self->pushTask(Scanner::doEndScope, currp);
            }
            auto& list = block->list;
            for (int i = int(list.size()) - 1; i >= 0; i--) {
              self->pushTask(Scanner::scan, &list[i]);
            }
            if (block->name.is()) {
              // Just call the task immediately.
              doBeginScope(self, currp);
            }
            return;
          }
          case Expression::Id::IfId: {
            if (curr->cast<If>()->ifFalse) {
              self->pushTask(Scanner::doEndScope, currp);
              self->maybePushTask(Scanner::scan, &curr->cast<If>()->ifFalse);
              self->pushTask(Scanner::doBeginScope, currp);
            }
            self->pushTask(Scanner::doEndScope, currp);
            self->pushTask(Scanner::scan, &curr->cast<If>()->ifTrue);
            self->pushTask(Scanner::doBeginScope, currp);
            // Immediately continue in the loop.
            currp = &curr->cast<If>()->condition;
            continue;
          }
          case Expression::Id::LoopId: {
            self->pushTask(Scanner::doEndScope, currp);
            // Just call the task immediately.
            doBeginScope(self, currp);
            // Immediately continue in the loop.
            currp = &curr->cast<Loop>()->body;
            continue;
          }
          case Expression::Id::TryId: {
            auto& list = curr->cast<Try>()->catchBodies;
            for (int i = int(list.size()) - 1; i >= 0; i--) {
              self->pushTask(Scanner::doEndScope, currp);
              self->pushTask(Scanner::scan, &list[i]);
              self->pushTask(Scanner::doBeginScope, currp);
            }
            self->pushTask(Scanner::doEndScope, currp);
            // Just call the task immediately.
            doBeginScope(self, currp);
            // Immediately continue in the loop.
            currp = &curr->cast<Try>()->body;
            continue;
          }
          case Expression::Id::TryTableId: {
            self->pushTask(Scanner::doEndScope, currp);
            // Just call the task immediately.
            doBeginScope(self, currp);
            // Immediately continue in the try_table.
            currp = &curr->cast<TryTable>()->body;
            continue;
          }

          default: {
            // Control flow structures have been handled. This is an expression,
            // which we scan normally.
            assert(!Properties::isControlFlowStructure(curr));
            PostWalker<Scanner>::scan(self, currp);
            return;
          }
        }
      }
    }